

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O2

string * __thiscall
Assimp::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,char **in)

{
  byte *pbVar1;
  
  SkipSpacesAndLineEnd<char>((char **)this);
  pbVar1 = *(byte **)this;
  while ((0x20 < (ulong)*pbVar1 || ((0x100003601U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0))) {
    pbVar1 = pbVar1 + 1;
    *(byte **)this = pbVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

AI_FORCE_INLINE
std::string GetNextToken(const char*& in) {
    SkipSpacesAndLineEnd(&in);
    const char* cur = in;
    while ( !IsSpaceOrNewLine( *in ) ) {
        ++in;
    }
    return std::string(cur,(size_t)(in-cur));
}